

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::SparseNode::ByteSizeLong(SparseNode *this)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = (ulong)(-(uint)(this->value_ != 0.0) & 1) * 9;
  uVar1 = this->index_;
  if (uVar1 != 0) {
    if ((int)uVar1 < 0) {
      uVar4 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar1 | 1) != 0) {
        for (; (uVar1 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar4 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    sVar3 = sVar3 + uVar4;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t SparseNode::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SparseNode)
  size_t total_size = 0;

  // double value = 2;
  if (this->value() != 0) {
    total_size += 1 + 8;
  }

  // int32 index = 1;
  if (this->index() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->index());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}